

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::Shell_GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view in,int flags)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte bVar3;
  byte *pbVar4;
  uint uVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  iterator cit;
  byte *c;
  byte *end;
  string_view in_00;
  allocator<char> local_7d;
  uint local_7c;
  char *local_78;
  string ninjaConfigReplace;
  string local_50;
  
  uVar5 = (uint)in._M_str;
  c = (byte *)in._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar9 = uVar5;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  in_00._M_str._4_4_ = 0;
  in_00._0_12_ = in._0_12_;
  bVar2 = Shell_ArgumentNeedsQuotes(this,in_00,uVar9);
  bVar6 = (byte)in._M_str;
  cVar7 = (char)__return_storage_ptr__;
  if (bVar2) {
    if (((char)bVar6 < '\0') && ((uVar5 >> 8 & 1) != 0)) {
      std::__cxx11::string::push_back(cVar7);
    }
    std::__cxx11::string::push_back(cVar7);
  }
  end = c + (long)&this->StateSnapshot;
  local_7c = uVar5 & 9;
  local_78 = "$$";
  if (((undefined1  [16])in & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_78 = "\"$\"";
  }
  uVar9 = 0;
  for (; c != end; c = c + 1) {
    if ((((undefined1  [16])in & (undefined1  [16])0x40) != (undefined1  [16])0x0) &&
       (pbVar4 = (byte *)Shell_SkipMakeVariables((iterator)c,(iterator)end), pbVar4 != c)) {
      for (; c != pbVar4; c = c + 1) {
        std::__cxx11::string::push_back(cVar7);
      }
      uVar9 = 0;
      if (pbVar4 == end) break;
    }
    if ((uVar5 >> 8 & 1) == 0) {
      if (((undefined1  [16])in & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
LAB_00199d6f:
        bVar3 = *c;
        goto LAB_00199d72;
      }
      bVar3 = *c;
      if (bVar3 != 0x5c) {
        if (bVar3 != 0x22) {
          uVar9 = 0;
          goto LAB_00199d72;
        }
        iVar8 = uVar9 + 1;
        while (iVar8 = iVar8 + -1, 0 < iVar8) {
          std::__cxx11::string::push_back(cVar7);
        }
        std::__cxx11::string::push_back(cVar7);
        uVar9 = (int)uVar9 >> 0x1f & uVar9;
        goto LAB_00199d6f;
      }
      uVar9 = uVar9 + 1;
LAB_00199ddc:
      std::__cxx11::string::push_back(cVar7);
    }
    else {
      bVar3 = *c;
      if ((bVar3 - 0x22 < 0x3f) &&
         ((0x4400000000000005U >> ((ulong)(bVar3 - 0x22) & 0x3f) & 1) != 0)) {
        std::__cxx11::string::push_back(cVar7);
        goto LAB_00199d6f;
      }
LAB_00199d72:
      if (bVar3 == 0x23) {
        if (local_7c != 9) goto LAB_00199daa;
      }
      else {
        if (bVar3 == 0x3b) {
          auVar1 = (undefined1  [16])in & (undefined1  [16])0x2;
        }
        else {
          if (bVar3 == 0x25) {
            if ((((undefined1  [16])in & (undefined1  [16])0x30) != (undefined1  [16])0x0 & bVar6)
                == 0 && (char)((uVar5 & 2) >> 1) == '\0') goto LAB_00199daa;
            goto LAB_00199d93;
          }
          if (bVar3 != 0x24) goto LAB_00199ddc;
          auVar1 = (undefined1  [16])in & (undefined1  [16])0x3;
        }
        if (auVar1 == (undefined1  [16])0x0) {
LAB_00199daa:
          std::__cxx11::string::push_back(cVar7);
          goto LAB_00199de7;
        }
      }
LAB_00199d93:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
LAB_00199de7:
  }
  if (bVar2) {
    iVar8 = uVar9 + 1;
    while (iVar8 = iVar8 + -1, 0 < iVar8) {
      std::__cxx11::string::push_back(cVar7);
    }
    if ((-1 < (char)bVar6) || (std::__cxx11::string::push_back(cVar7), (uVar5 >> 8 & 1) != 0)) {
      std::__cxx11::string::push_back(cVar7);
    }
  }
  if ((uVar5 >> 9 & 1) != 0) {
    ninjaConfigReplace._M_dataplus._M_p = (pointer)&ninjaConfigReplace.field_2;
    ninjaConfigReplace._M_string_length = 0;
    ninjaConfigReplace.field_2._M_local_buf[0] = '\0';
    if ((uVar5 >> 8 & 1) != 0) {
      std::__cxx11::string::push_back((char)&ninjaConfigReplace);
    }
    std::__cxx11::string::append((char *)&ninjaConfigReplace);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"${CONFIGURATION}",&local_7d);
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,&ninjaConfigReplace,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&ninjaConfigReplace);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Shell_GetArgument(cm::string_view in, int flags)
{
  /* Output will be at least as long as input string.  */
  std::string out;
  out.reserve(in.size());

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = Shell_ArgumentNeedsQuotes(in, flags);
  if (needQuotes) {
    /* Add the opening quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
      out += '\'';
    } else {
      out += '"';
    }
  }

  /* Scan the string for characters that require escaping or quoting.  */
  for (cm::string_view::iterator cit = in.begin(), cend = in.end();
       cit != cend; ++cit) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
      cm::string_view::iterator skip = Shell_SkipMakeVariables(cit, cend);
      if (skip != cit) {
        /* Copy to the end of the make variable references.  */
        while (cit != skip) {
          out += *cit++;
        }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if (cit == cend) {
          break;
        }
      }
    }

    /* Check whether this character needs escaping for the shell.  */
    if (flags & Shell_Flag_IsUnix) {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if (*cit == '\\' || *cit == '"' || *cit == '`' || *cit == '$') {
        /* This character needs a backslash to escape it.  */
        out += '\\';
      }
    } else if (flags & Shell_Flag_EchoWindows) {
      /* On Windows the built-in command shell echo never needs escaping.  */
    } else {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if (*cit == '\\') {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
      } else if (*cit == '"') {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while (windows_backslashes > 0) {
          --windows_backslashes;
          out += '\\';
        }

        /* Add the backslash to escape the double-quote.  */
        out += '\\';
      } else {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
      }
    }

    /* Check whether this character needs escaping for a make tool.  */
    if (*cit == '$') {
      if (flags & Shell_Flag_Make) {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        out += "$$";
      } else if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        out += "\"$\"";
      } else {
        /* Otherwise a dollar is written just $. */
        out += '$';
      }
    } else if (*cit == '#') {
      if ((flags & Shell_Flag_Make) && (flags & Shell_Flag_WatcomWMake)) {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        out += "$#";
      } else {
        /* Otherwise a pound is written just #. */
        out += '#';
      }
    } else if (*cit == '%') {
      if ((flags & Shell_Flag_VSIDE) ||
          ((flags & Shell_Flag_Make) &&
           ((flags & Shell_Flag_MinGWMake) || (flags & Shell_Flag_NMake)))) {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        out += "%%";
      } else {
        /* Otherwise a percent is written just %. */
        out += '%';
      }
    } else if (*cit == ';') {
      if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        out += "\";\"";
      } else {
        /* Otherwise a semicolon is written just ;. */
        out += ';';
      }
    } else {
      /* Store this character.  */
      out += *cit;
    }
  }

  if (needQuotes) {
    /* Add enough backslashes to escape any trailing ones.  */
    while (windows_backslashes > 0) {
      --windows_backslashes;
      out += '\\';
    }

    /* Add the closing quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      out += '\'';
      if (flags & Shell_Flag_IsUnix) {
        out += '"';
      }
    } else {
      out += '"';
    }
  }

  if (flags & Shell_Flag_UnescapeNinjaConfiguration) {
    std::string ninjaConfigReplace;
    if (flags & Shell_Flag_IsUnix) {
      ninjaConfigReplace += '\\';
    }
    ninjaConfigReplace += "$${CONFIGURATION}";
    cmSystemTools::ReplaceString(out, ninjaConfigReplace, "${CONFIGURATION}");
  }

  return out;
}